

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3SqlExec(int *pRC,Fts3Table *p,int eStmt,sqlite3_value **apVal)

{
  int iVar1;
  sqlite3_stmt *in_RDI;
  int rc;
  sqlite3_stmt *pStmt;
  sqlite3_value **in_stack_00000138;
  sqlite3_stmt **in_stack_00000140;
  int in_stack_0000014c;
  Fts3Table *in_stack_00000150;
  undefined4 in_stack_ffffffffffffffd0;
  
  if (*(int *)in_RDI == 0) {
    iVar1 = fts3SqlStmt(in_stack_00000150,in_stack_0000014c,in_stack_00000140,in_stack_00000138);
    if (iVar1 == 0) {
      sqlite3_step(in_RDI);
      iVar1 = sqlite3_reset((sqlite3_stmt *)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
    }
    *(int *)in_RDI = iVar1;
  }
  return;
}

Assistant:

static void fts3SqlExec(
  int *pRC,                /* Result code */
  Fts3Table *p,            /* The FTS3 table */
  int eStmt,               /* Index of statement to evaluate */
  sqlite3_value **apVal    /* Parameters to bind */
){
  sqlite3_stmt *pStmt;
  int rc;
  if( *pRC ) return;
  rc = fts3SqlStmt(p, eStmt, &pStmt, apVal); 
  if( rc==SQLITE_OK ){
    sqlite3_step(pStmt);
    rc = sqlite3_reset(pStmt);
  }
  *pRC = rc;
}